

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

void accum_global_mixw(model_inventory_t *inv,gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32 *puVar5;
  float32 ***pppfVar6;
  float32 ***pppfVar7;
  float32 *pfVar8;
  float32 *pfVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar1 = inv->n_mixw_inverse;
  if ((ulong)uVar1 != 0) {
    puVar5 = inv->mixw_inverse;
    pppfVar6 = inv->mixw_acc;
    pppfVar7 = inv->l_mixw_acc;
    uVar2 = g->n_feat;
    uVar3 = g->n_density;
    uVar10 = 0;
    do {
      if ((ulong)uVar2 != 0) {
        uVar4 = puVar5[uVar10];
        uVar11 = 0;
        do {
          if ((ulong)uVar3 != 0) {
            pfVar8 = pppfVar7[uVar10][uVar11];
            pfVar9 = pppfVar6[uVar4][uVar11];
            uVar12 = 0;
            do {
              pfVar9[uVar12] = (float32)((float)pfVar8[uVar12] + (float)pfVar9[uVar12]);
              uVar12 = uVar12 + 1;
            } while (uVar3 != uVar12);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar2);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar1);
  }
  return;
}

Assistant:

void
accum_global_mixw(model_inventory_t *inv, gauden_t *g)
{
    uint32 *global_mixw;	/* a mapping from local mixing weight id to global one */
    uint32 n_local;		/* # of local mixing weights */
    uint32 n_feat;		/* # of independent feature streams */
    uint32 n_density;		/* # of densities per mixture density */
    float32 ***mixw_acc;	/* global mixing weight accumulators */
    float32 ***l_mixw_acc;	/* local mixing weight accumulators */
    uint32 i, ii, j, k;		/* iterators and temporary variables */

    global_mixw = inv->mixw_inverse;
    n_local = inv->n_mixw_inverse;
    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    mixw_acc = inv->mixw_acc;
    l_mixw_acc = inv->l_mixw_acc;

    for (ii = 0; ii < n_local; ii++) {
	i = global_mixw[ii];
	    
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		mixw_acc[i][j][k] += l_mixw_acc[ii][j][k];
	    }
	}
    }
}